

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase615::run(TestCase615 *this)

{
  PointerBuilder builder_00;
  PointerBuilder builder_01;
  Builder reader_00;
  Builder reader_01;
  Reader reader_02;
  Reader reader_03;
  WirePointer *pWVar1;
  undefined1 uVar2;
  uint uVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ArrayPtr<const_unsigned_short> value;
  initializer_list<unsigned_char> expected;
  initializer_list<unsigned_short> expected_00;
  initializer_list<unsigned_char> expected_01;
  ArrayPtr<const_unsigned_short> value_00;
  initializer_list<unsigned_short> expected_02;
  uint local_3b0;
  uint local_3ac;
  Fault f_1;
  uint local_388;
  Reader reader;
  Builder root;
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>_> l;
  BuilderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> local_1b0;
  BuilderFor<capnp::List<unsigned_char,_(capnp::Kind)0>_> local_188;
  ReaderFor<capnp::List<unsigned_short,_(capnp::Kind)0>_> local_160;
  ReaderFor<capnp::List<unsigned_char,_(capnp::Kind)0>_> local_130;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&root,&builder.super_MessageBuilder);
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  reader._reader.segment = (SegmentReader *)CONCAT26(reader._reader.segment._6_2_,0x380022000c);
  builder_00.capTable = root._builder.capTable;
  builder_00.segment = root._builder.segment;
  builder_00.pointer = root._builder.pointers;
  value.size_ = 3;
  value.ptr = (unsigned_short *)&reader;
  PointerHelpers<capnp::List<unsigned_short,_(capnp::Kind)0>,_(capnp::Kind)6>::set(builder_00,value)
  ;
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_char,(capnp::Kind)0>>(&local_188,(Builder *)&l);
  reader._reader.segment = (SegmentReader *)CONCAT53(reader._reader.segment._3_5_,0x38220c);
  reader_00.builder.capTable = local_188.builder.capTable;
  reader_00.builder.segment = local_188.builder.segment;
  reader_00.builder.ptr = local_188.builder.ptr;
  reader_00.builder.elementCount = local_188.builder.elementCount;
  reader_00.builder.step = local_188.builder.step;
  reader_00.builder.structDataSize = local_188.builder.structDataSize;
  reader_00.builder.structPointerCount = local_188.builder.structPointerCount;
  reader_00.builder.elementSize = local_188.builder.elementSize;
  reader_00.builder._39_1_ = local_188.builder._39_1_;
  expected._M_len = 3;
  expected._M_array = (iterator)&reader;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_00,expected);
  reader._reader.segment = &(root._builder.segment)->super_SegmentReader;
  reader._reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  reader._reader.data = root._builder.pointers;
  AnyPointer::Builder::
  getAs<capnp::List<capnproto_test::capnp::test::TestLists::Struct8,(capnp::Kind)3>>
            (&l,(Builder *)&reader);
  if (l.builder.elementCount != 3) {
    f_1.exception._0_4_ = 3;
    local_3b0 = l.builder.elementCount;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              ((Fault *)&reader,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x271,FAILED,"(3u) == (l.size())","3u, l.size()",(uint *)&f_1,&local_3b0);
    kj::_::Debug::Fault::fatal((Fault *)&reader);
  }
  ListBuilder::getStructElement((StructBuilder *)&reader,&l.builder,0);
  if ((*reader._reader.data != '\f') && (kj::_::Debug::minSeverity < 3)) {
    f_1.exception._0_4_ = 0xc;
    ListBuilder::getStructElement((StructBuilder *)&reader,&l.builder,0);
    local_3b0 = CONCAT31(local_3b0._1_3_,*reader._reader.data);
    kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x272,ERROR,"\"failed: expected \" \"(12u) == (l[0].getF())\", 12u, l[0].getF()",
               (char (*) [40])"failed: expected (12u) == (l[0].getF())",(uint *)&f_1,
               (uchar *)&local_3b0);
  }
  ListBuilder::getStructElement((StructBuilder *)&reader,&l.builder,1);
  if ((*reader._reader.data != '\"') && (kj::_::Debug::minSeverity < 3)) {
    f_1.exception._0_4_ = 0x22;
    ListBuilder::getStructElement((StructBuilder *)&reader,&l.builder,1);
    local_3b0 = CONCAT31(local_3b0._1_3_,*reader._reader.data);
    kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x273,ERROR,"\"failed: expected \" \"(34u) == (l[1].getF())\", 34u, l[1].getF()",
               (char (*) [40])"failed: expected (34u) == (l[1].getF())",(uint *)&f_1,
               (uchar *)&local_3b0);
  }
  ListBuilder::getStructElement((StructBuilder *)&reader,&l.builder,2);
  if ((*reader._reader.data != '8') && (kj::_::Debug::minSeverity < 3)) {
    f_1.exception._0_4_ = 0x38;
    ListBuilder::getStructElement((StructBuilder *)&reader,&l.builder,2);
    local_3b0 = CONCAT31(local_3b0._1_3_,*reader._reader.data);
    kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x274,ERROR,"\"failed: expected \" \"(56u) == (l[2].getF())\", 56u, l[2].getF()",
               (char (*) [40])"failed: expected (56u) == (l[2].getF())",(uint *)&f_1,
               (uchar *)&local_3b0);
  }
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_1b0,(Builder *)&l);
  reader._reader.segment = (SegmentReader *)CONCAT26(reader._reader.segment._6_2_,0x380022000c);
  reader_01.builder.capTable = local_1b0.builder.capTable;
  reader_01.builder.segment = local_1b0.builder.segment;
  reader_01.builder.ptr = local_1b0.builder.ptr;
  reader_01.builder.elementCount = local_1b0.builder.elementCount;
  reader_01.builder.step = local_1b0.builder.step;
  reader_01.builder.structDataSize = local_1b0.builder.structDataSize;
  reader_01.builder.structPointerCount = local_1b0.builder.structPointerCount;
  reader_01.builder.elementSize = local_1b0.builder.elementSize;
  reader_01.builder._39_1_ = local_1b0.builder._39_1_;
  expected_00._M_len = 3;
  expected_00._M_array = (iterator)&reader;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_01,expected_00);
  StructBuilder::asReader(&root._builder);
  bVar4 = reader._reader.pointerCount != 0;
  l.builder.ptr = (byte *)(WirePointer *)0x0;
  if (bVar4) {
    l.builder.ptr = (byte *)reader._reader.pointers;
  }
  l.builder.elementCount = 0x7fffffff;
  if (bVar4) {
    l.builder.elementCount = reader._reader.nestingLimit;
  }
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  if (bVar4) {
    uVar5 = reader._reader.segment._0_4_;
    uVar6 = reader._reader.segment._4_4_;
    uVar7 = reader._reader.capTable._0_4_;
    uVar8 = reader._reader.capTable._4_4_;
  }
  l.builder.segment = (SegmentBuilder *)CONCAT44(uVar6,uVar5);
  l.builder.capTable = (CapTableBuilder *)CONCAT44(uVar8,uVar7);
  AnyPointer::Reader::getAs<capnp::List<unsigned_char,(capnp::Kind)0>>(&local_130,(Reader *)&l);
  f_1.exception._0_3_ = 0x38220c;
  reader_02.reader.capTable = local_130.reader.capTable;
  reader_02.reader.segment = local_130.reader.segment;
  reader_02.reader.ptr = local_130.reader.ptr;
  reader_02.reader.elementCount = local_130.reader.elementCount;
  reader_02.reader.step = local_130.reader.step;
  reader_02.reader.structDataSize = local_130.reader.structDataSize;
  reader_02.reader.structPointerCount = local_130.reader.structPointerCount;
  reader_02.reader.elementSize = local_130.reader.elementSize;
  reader_02.reader._39_1_ = local_130.reader._39_1_;
  reader_02.reader.nestingLimit = local_130.reader.nestingLimit;
  reader_02.reader._44_4_ = local_130.reader._44_4_;
  expected_01._M_len = 3;
  expected_01._M_array = (iterator)&f_1;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_char,_(capnp::Kind)0>_>
            (reader_02,expected_01);
  pWVar1 = (WirePointer *)0x0;
  if (reader._reader.pointerCount != 0) {
    pWVar1 = reader._reader.pointers;
  }
  f_1.exception._0_4_ = 0;
  f_1.exception._4_4_ = 0;
  if (reader._reader.pointerCount != 0) {
    f_1.exception._0_4_ = reader._reader.segment._0_4_;
    f_1.exception._4_4_ = reader._reader.segment._4_4_;
  }
  AnyPointer::Reader::
  getAs<capnp::List<capnproto_test::capnp::test::TestLists::Struct8,(capnp::Kind)3>>
            ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>_>
              *)&l,(Reader *)&f_1);
  if (l.builder.elementCount != 3) {
    local_3b0 = 3;
    local_3ac = l.builder.elementCount;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&f_1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x27f,FAILED,"(3u) == (l.size())","3u, l.size()",&local_3b0,&local_3ac);
    kj::_::Debug::Fault::fatal(&f_1);
  }
  ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&l,0);
  if (((local_388 < 8) || ((char)(pWVar1->offsetAndKind).value != '\f')) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_3b0 = 0xc;
    ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&l,0);
    if (local_388 < 8) {
      uVar2 = 0;
    }
    else {
      uVar2 = (undefined1)(pWVar1->offsetAndKind).value;
    }
    local_3ac = CONCAT31(local_3ac._1_3_,uVar2);
    kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x280,ERROR,"\"failed: expected \" \"(12u) == (l[0].getF())\", 12u, l[0].getF()",
               (char (*) [40])"failed: expected (12u) == (l[0].getF())",&local_3b0,
               (uchar *)&local_3ac);
  }
  ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&l,1);
  if (((local_388 < 8) || ((char)(pWVar1->offsetAndKind).value != '\"')) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_3b0 = 0x22;
    ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&l,1);
    if (local_388 < 8) {
      uVar2 = 0;
    }
    else {
      uVar2 = (undefined1)(pWVar1->offsetAndKind).value;
    }
    local_3ac = CONCAT31(local_3ac._1_3_,uVar2);
    kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x281,ERROR,"\"failed: expected \" \"(34u) == (l[1].getF())\", 34u, l[1].getF()",
               (char (*) [40])"failed: expected (34u) == (l[1].getF())",&local_3b0,
               (uchar *)&local_3ac);
  }
  ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&l,2);
  if (((local_388 < 8) || ((char)(pWVar1->offsetAndKind).value != '8')) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_3b0 = 0x38;
    ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&l,2);
    if (local_388 < 8) {
      uVar2 = 0;
    }
    else {
      uVar2 = (undefined1)(pWVar1->offsetAndKind).value;
    }
    local_3ac = CONCAT31(local_3ac._1_3_,uVar2);
    kj::_::Debug::log<char_const(&)[40],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x282,ERROR,"\"failed: expected \" \"(56u) == (l[2].getF())\", 56u, l[2].getF()",
               (char (*) [40])"failed: expected (56u) == (l[2].getF())",&local_3b0,
               (uchar *)&local_3ac);
  }
  l.builder.segment = root._builder.segment;
  l.builder.capTable = root._builder.capTable;
  l.builder.ptr = (byte *)root._builder.pointers;
  f_1.exception._0_6_ = 0x380022000c;
  builder_01.capTable = root._builder.capTable;
  builder_01.segment = root._builder.segment;
  builder_01.pointer = root._builder.pointers;
  value_00.size_ = 3;
  value_00.ptr = (unsigned_short *)&f_1;
  PointerHelpers<capnp::List<unsigned_short,_(capnp::Kind)0>,_(capnp::Kind)6>::set
            (builder_01,value_00);
  f_1.exception = (Exception *)&PTR_run_003916a0;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&l,(Runnable *)&f_1);
  if (((char)l.builder.segment == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[30],char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x28f,ERROR,
               "\"failed: expected \" \"e != nullptr\", \"Should have thrown an exception.\"",
               (char (*) [30])"failed: expected e != nullptr",
               (char (*) [33])"Should have thrown an exception.");
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&l);
  pWVar1 = (WirePointer *)0x0;
  if (reader._reader.pointerCount != 0) {
    pWVar1 = reader._reader.pointers;
  }
  f_1.exception._0_4_ = 0;
  f_1.exception._4_4_ = 0;
  if (reader._reader.pointerCount != 0) {
    f_1.exception._0_4_ = reader._reader.segment._0_4_;
    f_1.exception._4_4_ = reader._reader.segment._4_4_;
  }
  AnyPointer::Reader::
  getAs<capnp::List<capnproto_test::capnp::test::TestLists::Struct32,(capnp::Kind)3>>
            ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestLists::Struct32,_(capnp::Kind)3>_>
              *)&l,(Reader *)&f_1);
  if (l.builder.elementCount != 3) {
    local_3b0 = 3;
    local_3ac = l.builder.elementCount;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&f_1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x294,FAILED,"(3u) == (l.size())","3u, l.size()",&local_3b0,&local_3ac);
    kj::_::Debug::Fault::fatal(&f_1);
  }
  ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&l,0);
  if (((0x1f < local_388) && ((pWVar1->offsetAndKind).value != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_3b0 = 0;
    uVar3 = 0;
    ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&l,0);
    if (0x1f < local_388) {
      uVar3 = (pWVar1->offsetAndKind).value;
    }
    local_3ac = uVar3;
    kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x297,ERROR,"\"failed: expected \" \"(0u) == (l[0].getF())\", 0u, l[0].getF()",
               (char (*) [39])"failed: expected (0u) == (l[0].getF())",&local_3b0,&local_3ac);
  }
  ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&l,1);
  if (((0x1f < local_388) && ((pWVar1->offsetAndKind).value != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_3b0 = 0;
    ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&l,1);
    local_3ac = 0;
    if (0x1f < local_388) {
      local_3ac = (pWVar1->offsetAndKind).value;
    }
    kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x298,ERROR,"\"failed: expected \" \"(0u) == (l[1].getF())\", 0u, l[1].getF()",
               (char (*) [39])"failed: expected (0u) == (l[1].getF())",&local_3b0,&local_3ac);
  }
  ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&l,2);
  if (((0x1f < local_388) && ((pWVar1->offsetAndKind).value != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_3b0 = 0;
    ListReader::getStructElement((StructReader *)&f_1,(ListReader *)&l,2);
    local_3ac = 0;
    if (0x1f < local_388) {
      local_3ac = (pWVar1->offsetAndKind).value;
    }
    kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x299,ERROR,"\"failed: expected \" \"(0u) == (l[2].getF())\", 0u, l[2].getF()",
               (char (*) [39])"failed: expected (0u) == (l[2].getF())",&local_3b0,&local_3ac);
  }
  bVar4 = reader._reader.pointerCount != 0;
  l.builder.ptr = (byte *)(WirePointer *)0x0;
  if (bVar4) {
    l.builder.ptr = (byte *)reader._reader.pointers;
  }
  l.builder.elementCount = 0x7fffffff;
  if (bVar4) {
    l.builder.elementCount = reader._reader.nestingLimit;
  }
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  if (bVar4) {
    uVar5 = reader._reader.segment._0_4_;
    uVar6 = reader._reader.segment._4_4_;
    uVar7 = reader._reader.capTable._0_4_;
    uVar8 = reader._reader.capTable._4_4_;
  }
  l.builder.segment = (SegmentBuilder *)CONCAT44(uVar6,uVar5);
  l.builder.capTable = (CapTableBuilder *)CONCAT44(uVar8,uVar7);
  AnyPointer::Reader::getAs<capnp::List<unsigned_short,(capnp::Kind)0>>(&local_160,(Reader *)&l);
  f_1.exception._0_6_ = 0x380022000c;
  reader_03.reader.capTable = local_160.reader.capTable;
  reader_03.reader.segment = local_160.reader.segment;
  reader_03.reader.ptr = local_160.reader.ptr;
  reader_03.reader.elementCount = local_160.reader.elementCount;
  reader_03.reader.step = local_160.reader.step;
  reader_03.reader.structDataSize = local_160.reader.structDataSize;
  reader_03.reader.structPointerCount = local_160.reader.structPointerCount;
  reader_03.reader.elementSize = local_160.reader.elementSize;
  reader_03.reader._39_1_ = local_160.reader._39_1_;
  reader_03.reader.nestingLimit = local_160.reader.nestingLimit;
  reader_03.reader._44_4_ = local_160.reader._44_4_;
  expected_02._M_len = 3;
  expected_02._M_array = (iterator)&f_1;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Reader,_capnp::List<unsigned_short,_(capnp::Kind)0>_>
            (reader_03,expected_02);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Encoding, ListUpgrade) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();

  root.getAnyPointerField().setAs<List<uint16_t>>({12, 34, 56});

  checkList(root.getAnyPointerField().getAs<List<uint8_t>>(), {12, 34, 56});

  {
    auto l = root.getAnyPointerField().getAs<List<test::TestLists::Struct8>>();
    ASSERT_EQ(3u, l.size());
    EXPECT_EQ(12u, l[0].getF());
    EXPECT_EQ(34u, l[1].getF());
    EXPECT_EQ(56u, l[2].getF());
  }

  checkList(root.getAnyPointerField().getAs<List<uint16_t>>(), {12, 34, 56});

  auto reader = root.asReader();

  checkList(reader.getAnyPointerField().getAs<List<uint8_t>>(), {12, 34, 56});

  {
    auto l = reader.getAnyPointerField().getAs<List<test::TestLists::Struct8>>();
    ASSERT_EQ(3u, l.size());
    EXPECT_EQ(12u, l[0].getF());
    EXPECT_EQ(34u, l[1].getF());
    EXPECT_EQ(56u, l[2].getF());
  }

  root.getAnyPointerField().setAs<List<uint16_t>>({12, 34, 56});

  {
    kj::Maybe<kj::Exception> e = kj::runCatchingExceptions([&]() {
      reader.getAnyPointerField().getAs<List<uint32_t>>();
#if !KJ_NO_EXCEPTIONS
      ADD_FAILURE() << "Should have thrown an exception.";
#endif
    });

    KJ_EXPECT(e != nullptr, "Should have thrown an exception.");
  }

  {
    auto l = reader.getAnyPointerField().getAs<List<test::TestLists::Struct32>>();
    ASSERT_EQ(3u, l.size());

    // These should return default values because the structs aren't big enough.
    EXPECT_EQ(0u, l[0].getF());
    EXPECT_EQ(0u, l[1].getF());
    EXPECT_EQ(0u, l[2].getF());
  }

  checkList(reader.getAnyPointerField().getAs<List<uint16_t>>(), {12, 34, 56});
}